

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O2

LocalFederateId __thiscall
helics::EmptyCore::registerFederate(EmptyCore *this,string_view param_1,CoreFederateInfo *param_2)

{
  RegistrationFailure *this_00;
  string_view message;
  allocator<char> local_31;
  char *local_30;
  size_t local_28;
  
  this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28,param_1._M_len,param_1._M_str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Registration is not possible for Null Core",&local_31);
  message._M_str = local_30;
  message._M_len = local_28;
  RegistrationFailure::RegistrationFailure(this_00,message);
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

LocalFederateId EmptyCore::registerFederate(std::string_view /*name*/,
                                            const CoreFederateInfo& /*info*/)
{
    throw(RegistrationFailure(std::string("Registration is not possible for Null Core")));
}